

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class2_test_homography.cc
# Opt level: O0

void denormalize_correspondences
               (Correspondences2D2D *corr,int width1,int height1,int width2,int height2)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Correspondence2D2D *pCVar4;
  reference pvVar5;
  float fVar6;
  float fVar7;
  Correspondence2D2D *c;
  size_t i;
  float img2_maxdim;
  float img2_height;
  float img2_width;
  float img1_maxdim;
  float img1_height;
  float img1_width;
  int height2_local;
  int width2_local;
  int height1_local;
  int width1_local;
  Correspondences2D2D *corr_local;
  
  img1_height = (float)height2;
  img1_width = (float)width2;
  height2_local = height1;
  width2_local = width1;
  _height1_local = corr;
  piVar3 = std::max<int>(&width2_local,&height2_local);
  iVar1 = *piVar3;
  fVar6 = (float)(int)img1_width;
  fVar7 = (float)(int)img1_height;
  piVar3 = std::max<int>((int *)&img1_width,(int *)&img1_height);
  iVar2 = *piVar3;
  c = (Correspondence2D2D *)0x0;
  while( true ) {
    pCVar4 = (Correspondence2D2D *)
             std::vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>::size
                       (_height1_local);
    if (pCVar4 <= c) break;
    pvVar5 = std::vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>::at
                       (_height1_local,(size_type)c);
    pvVar5->p1[0] = (pvVar5->p1[0] * (double)iVar1 + (double)((float)width1 / 2.0)) - 0.5;
    pvVar5->p1[1] = (pvVar5->p1[1] * (double)iVar1 + (double)((float)height1 / 2.0)) - 0.5;
    pvVar5->p2[0] = (pvVar5->p2[0] * (double)iVar2 + (double)(fVar6 / 2.0)) - 0.5;
    pvVar5->p2[1] = (pvVar5->p2[1] * (double)iVar2 + (double)(fVar7 / 2.0)) - 0.5;
    c = (Correspondence2D2D *)((long)c->p1 + 1);
  }
  return;
}

Assistant:

void
denormalize_correspondences (sfm::Correspondences2D2D * corr, int width1, int height1,
    int width2, int height2)
{
    float const img1_width = static_cast<float>(width1);
    float const img1_height = static_cast<float>(height1);
    float const img1_maxdim = static_cast<float>(std::max(width1, height1));
    float const img2_width = static_cast<float>(width2);
    float const img2_height = static_cast<float>(height2);
    float const img2_maxdim = static_cast<float>(std::max(width2, height2));
    for (std::size_t i = 0; i < corr->size(); ++i)
    {
        sfm::Correspondence2D2D & c = corr->at(i);
        c.p1[0] = c.p1[0] * img1_maxdim + img1_width / 2.0f - 0.5f;
        c.p1[1] = c.p1[1] * img1_maxdim + img1_height / 2.0f - 0.5f;
        c.p2[0] = c.p2[0] * img2_maxdim + img2_width / 2.0f - 0.5f;
        c.p2[1] = c.p2[1] * img2_maxdim + img2_height / 2.0f - 0.5f;
    }
}